

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void despot::SetSize<double>
               (vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                *v,int d1,int d2,int d3)

{
  ulong uVar1;
  long lVar2;
  
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(v,(long)d1);
  if (0 < d1) {
    uVar1 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((v->
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar1,(long)d2);
      if (0 < d2) {
        lVar2 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     (*(long *)&(v->
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar1].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar2),(long)d3);
          lVar2 = lVar2 + 0x18;
        } while ((ulong)(uint)d2 * 0x18 != lVar2);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)d1);
  }
  return;
}

Assistant:

void SetSize(std::vector<std::vector<std::vector<T> > >& v, int d1, int d2, int d3) {
	v.resize(d1);
	for(int i=0; i<d1; i++) {
		v[i].resize(d2);
		for(int j=0; j<d2; j++)
		v[i][j].resize(d3);
	}
}